

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O0

void __thiscall Kernel::UnstableVarIt::UnstableVarIt(UnstableVarIt *this,Term *t)

{
  bool bVar1;
  TermList TVar2;
  Term *in_RSI;
  IteratorCore<Kernel::TermList> *in_RDI;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  TermList in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  Stack<Kernel::TermList> *in_stack_ffffffffffffff80;
  
  Lib::IteratorCore<Kernel::TermList>::IteratorCore(in_RDI);
  in_RDI->_vptr_IteratorCore = (_func_int **)&PTR__UnstableVarIt_01320510;
  TermList::TermList((TermList *)(in_RDI + 1));
  Lib::Stack<bool>::Stack((Stack<bool> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Lib::Stack<Kernel::TermList>::Stack(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  TVar2 = TermList::empty();
  in_RDI[1]._vptr_IteratorCore = (_func_int **)TVar2._content;
  bVar1 = Term::isLiteral((Term *)0x849d6c);
  if (bVar1) {
    Term::nthArgument(in_RSI,0);
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff70);
    Term::nthArgument(in_RSI,1);
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff70);
    Lib::Stack<bool>::push
              ((Stack<bool> *)in_stack_ffffffffffffff70._content,(bool)in_stack_ffffffffffffff6f);
    Lib::Stack<bool>::push
              ((Stack<bool> *)in_stack_ffffffffffffff70._content,(bool)in_stack_ffffffffffffff6f);
  }
  else {
    Lib::Stack<bool>::push
              ((Stack<bool> *)in_stack_ffffffffffffff70._content,(bool)in_stack_ffffffffffffff6f);
    TVar2._content = (uint64_t)&in_RDI[3]._refCnt;
    TermList::TermList((TermList *)TVar2._content,
                       (Term *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),TVar2);
  }
  return;
}

Assistant:

UnstableVarIt(Term* t) : _stable(8), _stack(8)
  {
    _next = TermList::empty();
    if(t->isLiteral()){
      _stack.push(*t->nthArgument(0));
      _stack.push(*t->nthArgument(1));
      _stable.push(true);
      _stable.push(true);   
      return;      
    }
    _stable.push(true);
    _stack.push(TermList(t)); 
  }